

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v1.cpp
# Opt level: O2

void __thiscall intel_acbp_v1_t::_read(intel_acbp_v1_t *this)

{
  kstream *pkVar1;
  byte bVar2;
  uint8_t uVar3;
  bool bVar4;
  uint16_t uVar5;
  pointer __p;
  structure_ids_t sVar6;
  pointer __p_00;
  acbp_element_t *this_00;
  validation_not_equal_error<intel_acbp_v1_t::structure_ids_t> *this_01;
  validation_expr_error<unsigned_char> *this_02;
  pointer *__ptr;
  _Head_base<0UL,_std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>_*,_false>
  local_88;
  allocator local_79;
  structure_ids_t local_78;
  string local_70;
  string local_50;
  
  sVar6 = kaitai::kstream::read_u8le((this->super_kstruct).m__io);
  this->m_structure_id = sVar6;
  if (sVar6 != STRUCTURE_IDS_ACBP) {
    this_01 = (validation_not_equal_error<intel_acbp_v1_t::structure_ids_t> *)
              __cxa_allocate_exception(0x48);
    local_88._M_head_impl =
         (vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>
          *)0x5f5f504243415f5f;
    local_78 = this->m_structure_id;
    pkVar1 = (this->super_kstruct).m__io;
    std::__cxx11::string::string((string *)&local_50,"/seq/0",&local_79);
    kaitai::validation_not_equal_error<intel_acbp_v1_t::structure_ids_t>::validation_not_equal_error
              (this_01,(structure_ids_t *)&local_88,&local_78,pkVar1,&local_50);
    __cxa_throw(this_01,&kaitai::validation_not_equal_error<intel_acbp_v1_t::structure_ids_t>::
                         typeinfo,kaitai::kstruct_error::~kstruct_error);
  }
  bVar2 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_version = bVar2;
  if (bVar2 < 0x20) {
    uVar3 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_reserved0 = uVar3;
    uVar3 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_bpm_revision = uVar3;
    uVar3 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_bp_svn = uVar3;
    uVar3 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_acm_svn = uVar3;
    uVar3 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
    this->m_reserved1 = uVar3;
    uVar5 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
    this->m_nem_data_size = uVar5;
    __p_00 = (pointer)operator_new(0x18);
    (__p_00->
    super__Vector_base<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__p_00->
    super__Vector_base<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p_00->
    super__Vector_base<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88._M_head_impl =
         (vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>
          *)0x0;
    std::
    __uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>_>_>
    ::reset((__uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>_>_>
             *)&this->m_elements,__p_00);
    std::
    unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>_>_>
                   *)&local_88);
    while( true ) {
      this_00 = (acbp_element_t *)operator_new(0x80);
      acbp_element_t::acbp_element_t(this_00,(this->super_kstruct).m__io,this,this->m__root);
      local_88._M_head_impl =
           (vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>
            *)this_00;
      std::
      vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>>>
      ::
      emplace_back<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>>
                ((vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>,std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,std::default_delete<intel_acbp_v1_t::acbp_element_t>>>>
                  *)(this->m_elements)._M_t.
                    super___uniq_ptr_impl<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>_>_>
                    .
                    super__Head_base<0UL,_std::vector<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>_*,_false>
                    ._M_head_impl,
                 (unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>
                  *)&local_88);
      if ((acbp_element_t *)local_88._M_head_impl != (acbp_element_t *)0x0) {
        (*(code *)((local_88._M_head_impl)->
                  super__Vector_base<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>,_std::allocator<std::unique_ptr<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                  super___uniq_ptr_impl<intel_acbp_v1_t::acbp_element_t,_std::default_delete<intel_acbp_v1_t::acbp_element_t>_>
                  ._M_t)();
      }
      if (((this_00->m_header)._M_t.
           super___uniq_ptr_impl<intel_acbp_v1_t::common_header_t,_std::default_delete<intel_acbp_v1_t::common_header_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_intel_acbp_v1_t::common_header_t_*,_std::default_delete<intel_acbp_v1_t::common_header_t>_>
           .super__Head_base<0UL,_intel_acbp_v1_t::common_header_t_*,_false>._M_head_impl)->
          m_structure_id == STRUCTURE_IDS_PMSG) break;
      bVar4 = kaitai::kstream::is_eof((this->super_kstruct).m__io);
      if (bVar4) {
        return;
      }
    }
    return;
  }
  this_02 = (validation_expr_error<unsigned_char> *)__cxa_allocate_exception(0x40);
  local_88._M_head_impl._0_1_ = this->m_version;
  pkVar1 = (this->super_kstruct).m__io;
  std::__cxx11::string::string((string *)&local_70,"/seq/1",(allocator *)&local_78);
  kaitai::validation_expr_error<unsigned_char>::validation_expr_error
            (this_02,(uchar *)&local_88,pkVar1,&local_70);
  __cxa_throw(this_02,&kaitai::validation_expr_error<unsigned_char>::typeinfo,
              kaitai::kstruct_error::~kstruct_error);
}

Assistant:

void intel_acbp_v1_t::_read() {
    m_structure_id = static_cast<intel_acbp_v1_t::structure_ids_t>(m__io->read_u8le());
    if (!(structure_id() == intel_acbp_v1_t::STRUCTURE_IDS_ACBP)) {
        throw kaitai::validation_not_equal_error<intel_acbp_v1_t::structure_ids_t>(intel_acbp_v1_t::STRUCTURE_IDS_ACBP, structure_id(), _io(), std::string("/seq/0"));
    }
    m_version = m__io->read_u1();
    {
        uint8_t _ = version();
        if (!(_ < 32)) {
            throw kaitai::validation_expr_error<uint8_t>(version(), _io(), std::string("/seq/1"));
        }
    }
    m_reserved0 = m__io->read_u1();
    m_bpm_revision = m__io->read_u1();
    m_bp_svn = m__io->read_u1();
    m_acm_svn = m__io->read_u1();
    m_reserved1 = m__io->read_u1();
    m_nem_data_size = m__io->read_u2le();
    m_elements = std::unique_ptr<std::vector<std::unique_ptr<acbp_element_t>>>(new std::vector<std::unique_ptr<acbp_element_t>>());
    {
        int i = 0;
        acbp_element_t* _;
        do {
            _ = new acbp_element_t(m__io, this, m__root);
            m_elements->push_back(std::move(std::unique_ptr<acbp_element_t>(_)));
            i++;
        } while (!( ((_->header()->structure_id() == intel_acbp_v1_t::STRUCTURE_IDS_PMSG) || (_io()->is_eof())) ));
    }
}